

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O2

void __thiscall Car::set_xpos(Car *this,int x)

{
  std::mutex::lock(&this->mtx);
  this->_xpos = x;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void Car::set_xpos(int x){
        std::lock_guard lck(mtx);
        _xpos = x;
    }